

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
Chainstate::Chainstate
          (Chainstate *this,CTxMemPool *mempool,BlockManager *blockman,ChainstateManager *chainman,
          optional<uint256> from_snapshot_blockhash)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined1 in_stack_00000028;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
  *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 0x28) = in_RSI;
  std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>::
  unique_ptr<std::default_delete<CoinsViews>,void>
            ((unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *)in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = in_RDX;
  *(undefined8 *)(in_RDI + 0x50) = in_RCX;
  CChain::CChain((CChain *)in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0x90) = in_stack_00000028;
  *(undefined8 *)(in_RDI + 0x80) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0x88) = in_stack_00000020;
  *(undefined8 *)(in_RDI + 0x70) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x78) = in_stack_00000010;
  std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::set
            (in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff88);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate::Chainstate(
    CTxMemPool* mempool,
    BlockManager& blockman,
    ChainstateManager& chainman,
    std::optional<uint256> from_snapshot_blockhash)
    : m_mempool(mempool),
      m_blockman(blockman),
      m_chainman(chainman),
      m_from_snapshot_blockhash(from_snapshot_blockhash) {}